

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O3

gtoken_t lexer_scan_number(gravity_lexer_t *lexer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  bool bVar6;
  uint uVar7;
  gtoken_t gVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  pcVar5 = lexer->buffer;
  uVar11 = lexer->offset;
  if (pcVar5[uVar11] == '0') {
    uVar7 = lexer->length;
    iVar9 = 0;
    if (uVar11 < uVar7) {
      iVar9 = (int)pcVar5[(ulong)uVar11 + 1];
    }
    iVar9 = toupper(iVar9);
    bVar6 = false;
    iVar10 = 0;
    if (iVar9 == 0x58) {
      uVar7 = 1;
    }
    else {
      if (uVar11 < uVar7) {
        iVar10 = (int)pcVar5[(ulong)uVar11 + 1];
      }
      iVar9 = toupper(iVar10);
      iVar10 = 0;
      bVar6 = false;
      if (iVar9 == 0x42) {
        uVar7 = 2;
      }
      else {
        if (uVar11 < uVar7) {
          iVar10 = (int)pcVar5[(ulong)uVar11 + 1];
        }
        iVar9 = toupper(iVar10);
        bVar6 = iVar9 != 0x4f;
        uVar7 = (uint)(iVar9 == 0x4f) * 3;
      }
    }
  }
  else {
    uVar7 = 0;
    bVar6 = true;
  }
  (lexer->token).type = TOK_EOF;
  (lexer->token).lineno = 0;
  (lexer->token).colno = 0;
  (lexer->token).position = 0;
  (lexer->token).bytes = 0;
  (lexer->token).length = 0;
  (lexer->token).fileid = 0;
  (lexer->token).builtin = BUILTIN_NONE;
  uVar3 = lexer->position;
  uVar4 = lexer->lineno;
  (lexer->token).position = uVar3;
  (lexer->token).value = pcVar5 + uVar11;
  (lexer->token).lineno = uVar4;
  uVar4 = lexer->colno;
  (lexer->token).colno = uVar4;
  if (!bVar6) {
    uVar1 = (lexer->token).bytes;
    uVar2 = (lexer->token).length;
    (lexer->token).bytes = uVar1 + 2;
    (lexer->token).length = uVar2 + 2;
    uVar11 = uVar11 + 2;
    lexer->offset = uVar11;
    lexer->colno = uVar4 + 2;
    lexer->position = uVar3 + 2;
  }
  if (uVar11 < lexer->length) {
    gVar8 = (*(code *)(&DAT_00144b14 + *(int *)(&DAT_00144b14 + (ulong)uVar7 * 4)))();
    return gVar8;
  }
  (lexer->token).type = TOK_NUMBER;
  (lexer->token).fileid = lexer->fileid;
  return TOK_NUMBER;
}

Assistant:

static gtoken_t lexer_scan_number(gravity_lexer_t *lexer) {
    bool        floatAllowed = true;
    bool        expAllowed = true;
    bool        signAllowed = false;
    bool        dotFound = false;
    bool        expFound = false;
    int            c, expChar = 'e', floatChar = '.';
    int            plusSign = '+', minusSign = '-';

    gravity_number_type    ntype = NUMBER_INTEGER;
    if (PEEK_CURRENT == '0') {
        if (toupper(PEEK_NEXT) == 'X') {ntype = NUMBER_HEX; floatAllowed = false; expAllowed = false;}
        else if (toupper(PEEK_NEXT) == 'B') {ntype = NUMBER_BIN; floatAllowed = false; expAllowed = false;}
        else if (toupper(PEEK_NEXT) == 'O') {ntype = NUMBER_OCT; floatAllowed = false; expAllowed = false;}
    }

    TOKEN_RESET;
    if (ntype != NUMBER_INTEGER) {
        // skip first 0* number marker
        INC_TOKLEN;
        INC_TOKLEN;
        INC_OFFSET_POSITION;
        INC_OFFSET_POSITION;
    }

    // supported exp formats:
    // 12345    // decimal
    // 3.1415    // float
    // 1.25e2 = 1.25 * 10^2 = 125.0        // scientific notation
    // 1.25e-2 = 1.25 * 10^-2 = 0.0125    // scientific notation
    // 0xFFFF    // hex
    // 0B0101    // binary
    // 0O7777    // octal

loop:
    c = PEEK_CURRENT;

    // explicitly list all accepted cases
    if (IS_EOF) goto report_token;
    if (is_digit(c, ntype)) goto accept_char;
    if (is_whitespace(c)) goto report_token;
    if (is_newline(lexer, c)) goto report_token;

    if (expAllowed) {
        if ((c == expChar) && (!expFound)) {expFound = true; signAllowed = true; goto accept_char;}
    }
    if (floatAllowed) {
        if ((c == floatChar) && (!is_digit(PEEK_NEXT, ntype))) goto report_token;
        if ((c == floatChar) && (!dotFound))  {dotFound = true; goto accept_char;}
    }
    if (signAllowed) {
        if ((c == plusSign) || (c == minusSign)) {signAllowed = false; goto accept_char;}
    }
    if (is_builtin_operator(c)) goto report_token;
    if (is_semicolon(c)) goto report_token;

    // any other case is an error
    goto report_error;

accept_char:
    INC_TOKLEN;
    INC_OFFSET_POSITION;
    goto loop;

report_token:
    // number is from buffer->[nseek] and it is bytes length
    TOKEN_FINALIZE(TOK_NUMBER);

    DEBUG_LEXEM("Found number: %.*s", TOKEN_BYTES(lexer->token), TOKEN_VALUE(lexer->token));
    return TOK_NUMBER;

report_error:
    return lexer_error(lexer, "Malformed number expression.");
}